

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Context **ppCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  Context *context;
  long lVar5;
  pointer pcVar6;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var7;
  bool bVar8;
  int iVar9;
  JavaType type;
  mapped_type *pmVar10;
  LogMessage *pLVar11;
  long *plVar12;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  ImmutableMessageGenerator *extraout_RDX_01;
  ImmutableMessageGenerator *extraout_RDX_02;
  ImmutableMessageGenerator *extraout_RDX_03;
  ImmutableMessageGenerator *pIVar13;
  size_type sVar14;
  Descriptor *pDVar15;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_06;
  char *pcVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ImmutableMessageGenerator *pIVar21;
  uint uVar22;
  long lVar23;
  ImmutableMessageGenerator messageGenerator;
  string out;
  string out_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  LogMessage local_1e0;
  long local_1a8;
  string local_1a0;
  string builder_type;
  SubstituteArg local_160;
  string local_130;
  char *local_110;
  undefined8 local_108;
  char local_100 [16];
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (*(long *)(pDVar15 + 0x18) == 0) {
    pcVar16 = " static ";
    if (*(char *)(*(long *)(*(long *)(pDVar15 + 0x10) + 0x88) + 0x98) != '\0') {
      pcVar16 = " ";
    }
  }
  else {
    pcVar16 = " static ";
  }
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &variables._M_t._M_impl.super__Rb_tree_header._M_header;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppCVar1 = &messageGenerator.context_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"static","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&variables,(key_type *)&messageGenerator);
  pcVar4 = (char *)pmVar10->_M_string_length;
  strlen(pcVar16);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar4,(ulong)pcVar16);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  }
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"classname","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_assign((string *)pmVar10);
  pDVar15 = extraout_RDX;
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
    pDVar15 = extraout_RDX_00;
  }
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&messageGenerator,(java *)(this->super_MessageGenerator).descriptor_,pDVar15)
  ;
  pcVar6 = (pointer)((long)&local_1e0 + 0x10);
  local_1e0._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"extra_interfaces","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&variables,(key_type *)&local_1e0);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&messageGenerator);
  if ((pointer)local_1e0._0_8_ != pcVar6) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  }
  messageGenerator.context_._0_2_ = 0x3356;
  messageGenerator.super_MessageGenerator.descriptor_ = (Descriptor *)0x2;
  messageGenerator.context_._2_1_ = 0;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
  local_1e0._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"ver","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&variables,(key_type *)&local_1e0);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&messageGenerator);
  if ((pointer)local_1e0._0_8_ != pcVar6) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  }
  pcVar16 = "";
  if (*(char *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x20) + 0x4a) != '\0') {
    pcVar16 = "@java.lang.Deprecated ";
  }
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"deprecation","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar10,0,(char *)pmVar10->_M_string_length,(ulong)pcVar16);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  }
  pIVar13 = this;
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"");
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar15,true,(string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  }
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  if (*(int *)((pIVar13->super_MessageGenerator).descriptor_ + 0x78) < 1) {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname","classname",(pIVar13->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,&variables,
                       "    com.google.protobuf.GeneratedMessage$ver$ implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    paVar2 = &local_1a0.field_2;
    local_1a0.field_2._M_allocated_capacity._0_2_ = 0x3356;
    local_1a0._M_string_length = 2;
    local_1a0.field_2._M_local_buf[2] = '\0';
    messageGenerator.super_MessageGenerator.descriptor_ =
         (Descriptor *)CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,2);
    local_1e0._0_8_ = (char *)0x0;
    local_1e0.filename_._0_4_ = -1;
    out._M_dataplus._M_p = (pointer)0x0;
    out._M_string_length = CONCAT44(out._M_string_length._4_4_,0xffffffff);
    vars._M_t._M_impl._0_8_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    out_2._M_dataplus._M_p = (pointer)0x0;
    out_2._M_string_length._0_4_ = 0xffffffff;
    local_160.text_ = (char *)0x0;
    local_160.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)paVar2;
    local_1a0._M_dataplus._M_p = (pointer)paVar2;
    strings::Substitute_abi_cxx11_
              (&local_130,(strings *)"com.google.protobuf.GeneratedMessage$0.Builder<?>",
               (char *)&messageGenerator,(SubstituteArg *)&local_1e0,(SubstituteArg *)&out,
               (SubstituteArg *)&vars,(SubstituteArg *)&out_2,&local_160,&local_60,&local_90,
               &local_c0,&local_f0,(SubstituteArg *)pIVar13);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p == paVar2) goto LAB_002ac906;
  }
  else {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname","classname",(pIVar13->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,&variables,
                       "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n      $classname$> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_1a0,pIVar13->name_resolver_,(pIVar13->super_MessageGenerator).descriptor_,true
              );
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)local_1a0._M_dataplus._M_p;
    messageGenerator.super_MessageGenerator.descriptor_ =
         (Descriptor *)
         CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,
                  (undefined4)local_1a0._M_string_length);
    local_100[0] = 'V';
    local_100[1] = '3';
    local_108 = 2;
    local_100[2] = 0;
    local_1e0.filename_._0_4_ = 2;
    out._M_dataplus._M_p = (pointer)0x0;
    out._M_string_length = CONCAT44(out._M_string_length._4_4_,0xffffffff);
    vars._M_t._M_impl._0_8_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    out_2._M_dataplus._M_p = (pointer)0x0;
    out_2._M_string_length._0_4_ = 0xffffffff;
    local_160.text_ = (char *)0x0;
    local_160.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_1e0._0_8_ = local_100;
    local_110 = local_100;
    strings::Substitute_abi_cxx11_
              (&local_130,
               (strings *)"com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
               (char *)&messageGenerator,(SubstituteArg *)&local_1e0,(SubstituteArg *)&out,
               (SubstituteArg *)&vars,(SubstituteArg *)&out_2,&local_160,&local_60,&local_90,
               &local_c0,&local_f0,(SubstituteArg *)pIVar13);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p == &local_1a0.field_2) goto LAB_002ac906;
  }
  operator_delete(local_1a0._M_dataplus._M_p);
LAB_002ac906:
  io::Printer::Print<>(printer,"private static final long serialVersionUID = 0L;\n");
  io::Printer::Indent(printer);
  io::Printer::Print<char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            (printer,
             "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
             ,(char (*) [10])0x3aca6c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (pIVar13->super_MessageGenerator).descriptor_,(char (*) [12])"buildertype",
             &builder_type);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"private $classname$() {\n",(char (*) [10])0x3aca6c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (pIVar13->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  GenerateInitializers(pIVar13,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  io::Printer::Print(printer,&variables,
                     "@java.lang.Override\n@SuppressWarnings({\"unused\"})\nprotected java.lang.Object newInstance(\n    UnusedPrivateParameter unused) {\n  return new $classname$();\n}\n\n"
                    );
  io::Printer::Print<>
            (printer,
             "@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\ngetUnknownFields() {\n  return this.unknownFields;\n}\n"
            );
  bVar8 = Context::HasGeneratedMethods
                    (pIVar13->context_,(pIVar13->super_MessageGenerator).descriptor_);
  if (bVar8) {
    GenerateParsingConstructor(pIVar13,printer);
  }
  GenerateDescriptorMethods(pIVar13,printer);
  pDVar15 = (pIVar13->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar15 + 0x74)) {
    lVar19 = 0;
    lVar23 = 0;
    do {
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)&messageGenerator,
                 (EnumDescriptor *)(*(long *)(pDVar15 + 0x40) + lVar19),true,pIVar13->context_);
      EnumGenerator::Generate((EnumGenerator *)&messageGenerator,printer);
      EnumGenerator::~EnumGenerator((EnumGenerator *)&messageGenerator);
      lVar23 = lVar23 + 1;
      pDVar15 = (pIVar13->super_MessageGenerator).descriptor_;
      lVar19 = lVar19 + 0x50;
    } while (lVar23 < *(int *)(pDVar15 + 0x74));
  }
  pDVar15 = (pIVar13->super_MessageGenerator).descriptor_;
  pIVar21 = pIVar13;
  if (0 < *(int *)(pDVar15 + 0x70)) {
    lVar23 = 0;
    lVar19 = 0;
    do {
      if (*(char *)(*(long *)(*(long *)(pDVar15 + 0x38) + 0x20 + lVar23) + 0x4b) == '\0') {
        ImmutableMessageGenerator
                  (&messageGenerator,(Descriptor *)(*(long *)(pDVar15 + 0x38) + lVar23),
                   pIVar21->context_);
        GenerateInterface(&messageGenerator,printer);
        Generate(&messageGenerator,printer);
        messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
             (_func_int **)&PTR__ImmutableMessageGenerator_0046ea48;
        FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
        ~FieldGeneratorMap(&messageGenerator.field_generators_);
        pIVar13 = extraout_RDX_01;
      }
      lVar19 = lVar19 + 1;
      pDVar15 = (pIVar21->super_MessageGenerator).descriptor_;
      lVar23 = lVar23 + 0x90;
    } while (lVar19 < *(int *)(pDVar15 + 0x70));
  }
  pDVar15 = (pIVar21->super_MessageGenerator).descriptor_;
  if (*(int *)(pDVar15 + 0x68) < 1) {
    iVar17 = 0;
  }
  else {
    lVar23 = 0;
    lVar19 = 0;
    iVar17 = 0;
    pIVar13 = pIVar21;
    do {
      lVar20 = *(long *)(pDVar15 + 0x28);
      if (*(Descriptor **)(lVar20 + 0x50 + lVar23) != (pIVar13->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  (&local_1e0,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x87);
        pLVar11 = internal::LogMessage::operator<<
                            (&local_1e0,
                             "CHECK failed: (field->containing_type()) == (descriptor_): ");
        internal::LogFinisher::operator=((LogFinisher *)&messageGenerator,pLVar11);
        internal::LogMessage::~LogMessage(&local_1e0);
      }
      if (*(char *)(lVar20 + 0x42 + lVar23) == '\0') {
        plVar12 = (long *)(*(long *)(lVar20 + 0x50 + lVar23) + 0x28);
      }
      else {
        lVar5 = *(long *)(lVar20 + 0x60 + lVar23);
        if (lVar5 == 0) {
          plVar12 = (long *)(*(long *)(lVar20 + 0x28 + lVar23) + 0x80);
        }
        else {
          plVar12 = (long *)(lVar5 + 0x50);
        }
      }
      iVar9 = (**(code **)(*(long *)(pIVar13->field_generators_).field_generators_.
                                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(int)((ulong)((lVar20 - *plVar12) + lVar23) >> 3) * 0x286bca1b]
                                    ._M_t.
                                    super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                    ._M_t + 0x10))();
      iVar17 = iVar17 + iVar9;
      lVar19 = lVar19 + 1;
      pDVar15 = (pIVar13->super_MessageGenerator).descriptor_;
      lVar23 = lVar23 + 0x98;
      pIVar21 = pIVar13;
    } while (lVar19 < *(int *)(pDVar15 + 0x68));
  }
  if (0 < iVar17) {
    uVar18 = iVar17 + 0x1fU >> 5;
    uVar22 = 1;
    if (1 < uVar18) {
      uVar22 = uVar18;
    }
    uVar18 = 0;
    do {
      GetBitFieldName_abi_cxx11_((string *)&messageGenerator,(java *)(ulong)uVar18,(int)pIVar13);
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &messageGenerator);
      pIVar13 = extraout_RDX_02;
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
        pIVar13 = extraout_RDX_03;
      }
      uVar18 = uVar18 + 1;
    } while (uVar22 != uVar18);
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pDVar15 = (pIVar21->super_MessageGenerator).descriptor_;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(pDVar15 + 0x6c)) {
    paVar2 = &out.field_2;
    paVar3 = &out_2.field_2;
    lVar19 = 0;
    do {
      lVar23 = lVar19 * 0x30;
      local_1a8 = lVar19;
      Context::GetOneofGeneratorInfo
                (pIVar21->context_,(OneofDescriptor *)(*(long *)(pDVar15 + 0x30) + lVar23));
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"oneof_name","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,(key_type *)&messageGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar10);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
      }
      Context::GetOneofGeneratorInfo
                (pIVar21->context_,
                 (OneofDescriptor *)
                 (*(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x30) + lVar23));
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&messageGenerator,"oneof_capitalized_name","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,(key_type *)&messageGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar10);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
      }
      lVar19 = *(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x30);
      ppCVar1 = &messageGenerator.context_;
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
      pcVar16 = FastInt32ToBufferLeft
                          ((int)((ulong)((lVar19 + lVar23) -
                                        *(long *)(*(long *)(lVar19 + 0x10 + lVar23) + 0x30)) >> 4) *
                           -0x55555555,(char *)ppCVar1);
      messageGenerator.super_MessageGenerator.descriptor_ = (Descriptor *)(pcVar16 + -(long)ppCVar1)
      ;
      out._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                 messageGenerator.super_MessageGenerator.descriptor_ +
                 (long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
      out_2._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out_2,"oneof_index","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&out_2);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)&out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_2._M_dataplus._M_p != paVar3) {
        operator_delete(out_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar2) {
        operator_delete(out._M_dataplus._M_p);
      }
      io::Printer::Print(printer,&vars,
                         "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                        );
      io::Printer::Print(printer,&vars,
                         "public enum $oneof_capitalized_name$Case\n    implements com.google.protobuf.Internal.EnumLite,\n        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n"
                        );
      io::Printer::Indent(printer);
      lVar19 = *(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x30);
      if (0 < *(int *)(lVar19 + 0x18 + lVar23)) {
        lVar20 = 0;
        do {
          plVar12 = *(long **)(*(long *)(lVar19 + 0x20 + lVar23) + lVar20 * 8);
          local_160.text_ = "";
          if (*(char *)(plVar12[0xf] + 0x4e) != '\0') {
            local_160.text_ = "@java.lang.Deprecated ";
          }
          lVar19 = *(long *)*plVar12;
          out._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&out,lVar19,((long *)*plVar12)[1] + lVar19);
          if (out._M_string_length != 0) {
            sVar14 = 0;
            do {
              if ((byte)(out._M_dataplus._M_p[sVar14] + 0x9fU) < 0x1a) {
                out._M_dataplus._M_p[sVar14] = out._M_dataplus._M_p[sVar14] + -0x20;
              }
              sVar14 = sVar14 + 1;
            } while (out._M_string_length != sVar14);
          }
          ppCVar1 = &messageGenerator.context_;
          messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
          pcVar16 = FastInt32ToBufferLeft(*(int32 *)((long)plVar12 + 0x44),(char *)ppCVar1);
          messageGenerator.super_MessageGenerator.descriptor_ =
               (Descriptor *)(pcVar16 + -(long)ppCVar1);
          out_2._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out_2,messageGenerator.super_MessageGenerator._vptr_MessageGenerator
                     ,messageGenerator.super_MessageGenerator.descriptor_ +
                      (long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
          io::Printer::
          Print<char[12],char_const*,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                    (printer,"$deprecation$$field_name$($field_number$),\n",
                     (char (*) [12])"deprecation",&local_160.text_,(char (*) [11])0x3b3b74,&out,
                     (char (*) [13])"field_number",&out_2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_2._M_dataplus._M_p != paVar3) {
            operator_delete(out_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != paVar2) {
            operator_delete(out._M_dataplus._M_p);
          }
          lVar20 = lVar20 + 1;
          lVar19 = *(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x30);
        } while (lVar20 < *(int *)(lVar19 + 0x18 + lVar23));
      }
      out._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out,"oneof_name","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&out);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      pcVar6 = (pmVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&messageGenerator,pcVar6,pcVar6 + pmVar10->_M_string_length);
      if (messageGenerator.super_MessageGenerator.descriptor_ != (Descriptor *)0x0) {
        pDVar15 = (Descriptor *)0x0;
        do {
          if ((byte)((char)*(Descriptor *)
                            ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                            (long)pDVar15) + 0x9fU) < 0x1a) {
            *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                     (long)pDVar15) =
                 (char)*(Descriptor *)
                        ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                        (long)pDVar15) + -0x20;
          }
          pDVar15 = pDVar15 + 1;
        } while (messageGenerator.super_MessageGenerator.descriptor_ != pDVar15);
      }
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,"$cap_oneof_name$_NOT_SET(0);\n",(char (*) [15])"cap_oneof_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &messageGenerator);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar2) {
        operator_delete(out._M_dataplus._M_p);
      }
      io::Printer::Print(printer,&vars,
                         "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                        );
      io::Printer::Print(printer,&vars,
                         "/**\n * @param value The number of the enum to look for.\n * @return The enum associated with the given number.\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                        );
      lVar19 = *(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x30);
      if (0 < *(int *)(lVar19 + 0x18 + lVar23)) {
        lVar20 = 0;
        do {
          plVar12 = *(long **)(*(long *)(lVar19 + 0x20 + lVar23) + lVar20 * 8);
          ppCVar1 = &messageGenerator.context_;
          messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
          pcVar16 = FastInt32ToBufferLeft(*(int32 *)((long)plVar12 + 0x44),(char *)ppCVar1);
          messageGenerator.super_MessageGenerator.descriptor_ =
               (Descriptor *)(pcVar16 + -(long)ppCVar1);
          out._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                     messageGenerator.super_MessageGenerator.descriptor_ +
                     (long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
          plVar12 = (long *)*plVar12;
          lVar19 = *plVar12;
          out_2._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>((string *)&out_2,lVar19,plVar12[1] + lVar19);
          if (CONCAT44(out_2._M_string_length._4_4_,(undefined4)out_2._M_string_length) != 0) {
            lVar19 = 0;
            do {
              if ((byte)(out_2._M_dataplus._M_p[lVar19] + 0x9fU) < 0x1a) {
                out_2._M_dataplus._M_p[lVar19] = out_2._M_dataplus._M_p[lVar19] + -0x20;
              }
              lVar19 = lVar19 + 1;
            } while (CONCAT44(out_2._M_string_length._4_4_,(undefined4)out_2._M_string_length) !=
                     lVar19);
          }
          io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                    (printer,"    case $field_number$: return $field_name$;\n",
                     (char (*) [13])"field_number",&out,(char (*) [11])0x3b3b74,&out_2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_2._M_dataplus._M_p != paVar3) {
            operator_delete(out_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != paVar2) {
            operator_delete(out._M_dataplus._M_p);
          }
          lVar20 = lVar20 + 1;
          lVar19 = *(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x30);
        } while (lVar20 < *(int *)(lVar19 + 0x18 + lVar23));
      }
      out._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out,"oneof_name","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&out);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      pcVar6 = (pmVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&messageGenerator,pcVar6,pcVar6 + pmVar10->_M_string_length);
      if (messageGenerator.super_MessageGenerator.descriptor_ != (Descriptor *)0x0) {
        pDVar15 = (Descriptor *)0x0;
        do {
          if ((byte)((char)*(Descriptor *)
                            ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                            (long)pDVar15) + 0x9fU) < 0x1a) {
            *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                     (long)pDVar15) =
                 (char)*(Descriptor *)
                        ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                        (long)pDVar15) + -0x20;
          }
          pDVar15 = pDVar15 + 1;
        } while (messageGenerator.super_MessageGenerator.descriptor_ != pDVar15);
      }
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,
                 "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
                 ,(char (*) [15])"cap_oneof_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &messageGenerator);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar2) {
        operator_delete(out._M_dataplus._M_p);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"};\n\n");
      io::Printer::Print(printer,&vars,
                         "public $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\n"
                        );
      lVar19 = local_1a8 + 1;
      pDVar15 = (pIVar21->super_MessageGenerator).descriptor_;
    } while (lVar19 < *(int *)(pDVar15 + 0x6c));
  }
  pIVar13 = pIVar21;
  iVar17 = std::__cxx11::string::compare(*(char **)(pDVar15 + 8));
  field = extraout_RDX_04;
  if (iVar17 == 0) {
    io::Printer::Print<>
              (printer,
               "private static String getTypeUrl(\n    java.lang.String typeUrlPrefix,\n    com.google.protobuf.Descriptors.Descriptor descriptor) {\n  return typeUrlPrefix.endsWith(\"/\")\n      ? typeUrlPrefix + descriptor.getFullName()\n      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n}\n\nprivate static String getTypeNameFromTypeUrl(\n    java.lang.String typeUrl) {\n  int pos = typeUrl.lastIndexOf(\'/\');\n  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n}\n\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\n/**\n * Packs a message using the given type URL prefix. The type URL will\n * be constructed by concatenating the message type\'s full name to the\n * prefix with an optional \"/\" separator if the prefix doesn\'t end\n * with \"/\" already.\n */\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message, java.lang.String typeUrlPrefix) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\npublic <T extends com.google.protobuf.Message> boolean is(\n    java.lang.Class<T> clazz) {\n  T defaultInstance =\n      com.google.protobuf.Internal.getDefaultInstance(clazz);\n  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n      defaultInstance.getDescriptorForType().getFullName());\n}\n\nprivate volatile com.google.protobuf.Message cachedUnpackValue;\n\n@java.lang.SuppressWarnings(\"unchecked\")\npublic <T extends com.google.protobuf.Message> T unpack(\n    java.lang.Class<T> clazz)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  boolean invalidClazz = false;\n  if (cachedUnpackValue != null) {\n    if (cachedUnpackValue.getClass() == clazz) {\n      return (T) cachedUnpackValue;\n    }\n    invalidClazz = true;\n  }\n  if (invalidClazz || !is(clazz)) {\n    t..." /* TRUNCATED STRING LITERAL */
              );
    field = extraout_RDX_05;
  }
  pDVar15 = (pIVar21->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar15 + 0x68)) {
    paVar2 = &out.field_2;
    lVar19 = 0;
    lVar23 = 0;
    do {
      FieldConstantName_abi_cxx11_(&out_2,(java *)(*(long *)(pDVar15 + 0x28) + lVar19),field);
      out._M_dataplus._M_p = (pointer)paVar2;
      pcVar16 = FastInt32ToBufferLeft
                          (*(int32 *)(*(long *)((pIVar13->super_MessageGenerator).descriptor_ + 0x28
                                               ) + 0x44 + lVar19),paVar2->_M_local_buf);
      out._M_string_length = (long)pcVar16 - (long)paVar2;
      local_160.text_ = local_160.scratch_ + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_160,out._M_dataplus._M_p,
                 out._M_dataplus._M_p + out._M_string_length);
      io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,"public static final int $constant_name$ = $number$;\n",
                 (char (*) [14])0x3b1108,&out_2,(char (*) [7])0x3b3c9d,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160);
      if (local_160.text_ != local_160.scratch_ + 4) {
        operator_delete(local_160.text_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_2._M_dataplus._M_p != &out_2.field_2) {
        operator_delete(out_2._M_dataplus._M_p);
      }
      lVar20 = *(long *)((pIVar13->super_MessageGenerator).descriptor_ + 0x28);
      if (*(Descriptor **)(lVar20 + 0x50 + lVar19) != (pIVar13->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&messageGenerator,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x87);
        pLVar11 = internal::LogMessage::operator<<
                            ((LogMessage *)&messageGenerator,
                             "CHECK failed: (field->containing_type()) == (descriptor_): ");
        internal::LogFinisher::operator=((LogFinisher *)&out,pLVar11);
        internal::LogMessage::~LogMessage((LogMessage *)&messageGenerator);
      }
      if (*(char *)(lVar20 + 0x42 + lVar19) == '\0') {
        plVar12 = (long *)(*(long *)(lVar20 + 0x50 + lVar19) + 0x28);
      }
      else {
        lVar5 = *(long *)(lVar20 + 0x60 + lVar19);
        if (lVar5 == 0) {
          plVar12 = (long *)(*(long *)(lVar20 + 0x28 + lVar19) + 0x80);
        }
        else {
          plVar12 = (long *)(lVar5 + 0x50);
        }
      }
      _Var7._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
      _M_head_impl = (pIVar13->field_generators_).field_generators_.
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(int)((ulong)((lVar20 - *plVar12) + lVar19) >> 3) * 0x286bca1b]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var7._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                            ._M_head_impl + 0x28))
                (_Var7._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                 ._M_head_impl,printer);
      io::Printer::Print<>(printer,"\n");
      lVar23 = lVar23 + 1;
      pDVar15 = (pIVar13->super_MessageGenerator).descriptor_;
      lVar19 = lVar19 + 0x98;
      field = extraout_RDX_06;
    } while (lVar23 < *(int *)(pDVar15 + 0x68));
  }
  pIVar21 = pIVar13;
  bVar8 = Context::HasGeneratedMethods(pIVar13->context_,pDVar15);
  if (bVar8) {
    GenerateIsInitialized(pIVar13,printer);
    GenerateMessageSerializationMethods(pIVar13,printer);
    GenerateEqualsAndHashCode(pIVar13,printer);
  }
  GenerateParseFromMethods(pIVar13,printer);
  GenerateBuilder(pIVar13,printer);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n",
             (char (*) [10])0x3ab1b1,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((pIVar13->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetClassName_abi_cxx11_
            (&out,pIVar13->name_resolver_,(pIVar13->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"private static final $classname$ DEFAULT_INSTANCE;\n",(char (*) [10])0x3aca6c,
             &out);
  paVar2 = &out.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar2) {
    operator_delete(out._M_dataplus._M_p);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            (&out,pIVar21->name_resolver_,(pIVar21->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n",
             (char (*) [10])0x3aca6c,&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar2) {
    operator_delete(out._M_dataplus._M_p);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            (&out,pIVar21->name_resolver_,(pIVar21->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n",
             (char (*) [10])0x3aca6c,&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar2) {
    operator_delete(out._M_dataplus._M_p);
  }
  pIVar13 = pIVar21;
  iVar17 = std::__cxx11::string::compare
                     ((char *)**(undefined8 **)
                                ((pIVar21->super_MessageGenerator).descriptor_ + 0x10));
  if (iVar17 == 0) {
    ClassNameResolver::GetClassName_abi_cxx11_
              (&out,pIVar21->name_resolver_,(pIVar21->super_MessageGenerator).descriptor_,true);
    type = GetJavaType(*(FieldDescriptor **)((pIVar21->super_MessageGenerator).descriptor_ + 0x28));
    out_2._M_dataplus._M_p = PrimitiveTypeName(type);
    pIVar21 = pIVar13;
    io::Printer::Print<char[10],std::__cxx11::string,char[11],char_const*>
              (printer,
               "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
               ,(char (*) [10])0x3aca6c,&out,(char (*) [11])0x3c3190,(char **)&out_2);
    pIVar13 = pIVar21;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar2) {
      operator_delete(out._M_dataplus._M_p);
      pIVar13 = pIVar21;
    }
  }
  GenerateParser(pIVar21,printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&out,pIVar21->name_resolver_,(pIVar21->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
             ,(char (*) [10])0x3aca6c,&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar2) {
    operator_delete(out._M_dataplus._M_p);
  }
  pDVar15 = (pIVar13->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar15 + 0x7c)) {
    lVar19 = 0;
    lVar23 = 0;
    do {
      ImmutableExtensionGenerator::ImmutableExtensionGenerator
                ((ImmutableExtensionGenerator *)&out,
                 (FieldDescriptor *)(*(long *)(pDVar15 + 0x50) + lVar19),pIVar13->context_);
      ImmutableExtensionGenerator::Generate((ImmutableExtensionGenerator *)&out,printer);
      ImmutableExtensionGenerator::~ImmutableExtensionGenerator((ImmutableExtensionGenerator *)&out)
      ;
      lVar23 = lVar23 + 1;
      pDVar15 = (pIVar13->super_MessageGenerator).descriptor_;
      lVar19 = lVar19 + 0x98;
    } while (lVar23 < *(int *)(pDVar15 + 0x7c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)builder_type._M_dataplus._M_p != &builder_type.field_2) {
    operator_delete(builder_type._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&variables._M_t);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<std::string, std::string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["ver"] = GeneratedCodeVersionSuffix();
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);

  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_),
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
                   "    com.google.protobuf.GeneratedMessage$ver$ implements\n"
                   "    $extra_interfaces$\n"
                   "    $classname$OrBuilder {\n");
    builder_type =
        strings::Substitute("com.google.protobuf.GeneratedMessage$0.Builder<?>",
                            GeneratedCodeVersionSuffix());
  }
  printer->Print("private static final long serialVersionUID = 0L;\n");

  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
      "// Use $classname$.newBuilder() to construct.\n"
      "private $classname$($buildertype$ builder) {\n"
      "  super(builder);\n"
      "}\n",
      "classname", descriptor_->name(), "buildertype", builder_type);
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(variables,
                 "@java.lang.Override\n"
                 "@SuppressWarnings({\"unused\"})\n"
                 "protected java.lang.Object newInstance(\n"
                 "    UnusedPrivateParameter unused) {\n"
                 "  return new $classname$();\n"
                 "}\n"
                 "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public final com.google.protobuf.UnknownFieldSet\n"
      "getUnknownFields() {\n"
      "  return this.unknownFields;\n"
      "}\n");

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), true, context_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(descriptor_->nested_type(i),
                                               context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["oneof_name"] =
        context_->GetOneofGeneratorInfo(descriptor_->oneof_decl(i))->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(descriptor_->oneof_decl(i))
            ->capitalized_name;
    vars["oneof_index"] = StrCat(descriptor_->oneof_decl(i)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(
        vars,
        "public enum $oneof_capitalized_name$Case\n"
        // TODO(dweis): Remove EnumLite when we want to break compatibility with
        // 3.x users
        "    implements com.google.protobuf.Internal.EnumLite,\n"
        "        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "$deprecation$$field_name$($field_number$),\n", "deprecation",
          field->options().deprecated() ? "@java.lang.Deprecated " : "",
          "field_name", ToUpper(field->name()), "field_number",
          StrCat(field->number()));
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   ToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    printer->Print(
        vars,
        "/**\n"
        " * @param value The number of the enum to look for.\n"
        " * @return The enum associated with the given number.\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n"
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", StrCat(field->number()),
                     "field_name", ToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n");
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", StrCat(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
      "static {\n"
      "  DEFAULT_INSTANCE = new $classname$();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}